

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  element_type *peVar1;
  pointer pcVar2;
  test_fixture *this;
  bool bVar3;
  pointer psVar4;
  int iVar5;
  char *pcVar6;
  shared_ptr<test_fixture> *tf;
  pointer psVar7;
  bool bVar8;
  string fixture_name;
  long *local_70;
  char *local_68;
  long local_60 [2];
  long *local_50;
  char *local_48;
  long local_40 [2];
  
  std::set_terminate(handle_terminate);
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70);
  pcVar6 = local_68;
  if (1 < argc) {
    __s = argv[1];
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_70,0,pcVar6,(ulong)__s);
  }
  psVar4 = _test_fixtures.
           super__Vector_base<std::shared_ptr<test_fixture>,_std::allocator<std::shared_ptr<test_fixture>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_test_fixtures.
      super__Vector_base<std::shared_ptr<test_fixture>,_std::allocator<std::shared_ptr<test_fixture>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      _test_fixtures.
      super__Vector_base<std::shared_ptr<test_fixture>,_std::allocator<std::shared_ptr<test_fixture>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puts("\nSuccess.");
  }
  else {
    bVar3 = false;
    psVar7 = _test_fixtures.
             super__Vector_base<std::shared_ptr<test_fixture>,_std::allocator<std::shared_ptr<test_fixture>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (local_68 == (char *)0x0) {
LAB_00103b0e:
        test_fixture::run_tests
                  ((psVar7->super___shared_ptr<test_fixture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
        this = (psVar7->super___shared_ptr<test_fixture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if (this->_something_failed == true) {
          bVar3 = true;
          test_fixture::print_failures(this);
        }
      }
      else {
        peVar1 = (psVar7->super___shared_ptr<test_fixture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        pcVar2 = (peVar1->_fixture_name)._M_dataplus._M_p;
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + (peVar1->_fixture_name)._M_string_length);
        bVar8 = true;
        if (local_48 == local_68) {
          if (local_48 == (char *)0x0) {
            bVar8 = false;
          }
          else {
            iVar5 = bcmp(local_50,local_70,(size_t)local_48);
            bVar8 = iVar5 != 0;
          }
        }
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        if (!bVar8) goto LAB_00103b0e;
      }
      psVar7 = psVar7 + 1;
    } while (psVar7 != psVar4);
    pcVar6 = "\nSuccess.";
    if (bVar3) {
      pcVar6 = "\nFailure.";
    }
    puts(pcVar6);
    if (bVar3) {
      system("/bin/bash -c \'read -p \"Press Any Key\"\'");
    }
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return 0;
}

Assistant:

int main( int argc, char* argv[] )
{
    set_terminate( handle_terminate );

    std::string fixture_name = "";

    if( argc > 1 )
        fixture_name = argv[1];

#ifdef IS_WINDOWS
    srand( (unsigned int)GetSystemTimeAsUnixTime() );
#endif
#ifdef IS_LINUX
    srand( time(0) );
#endif

    bool something_failed = false;

    for(auto& tf : _test_fixtures)
    {
        if( !fixture_name.empty() )
            if(tf->get_name() != fixture_name )
                continue;

        tf->run_tests();

        if( tf->something_failed() )
        {
            something_failed = true;
            tf->print_failures();
        }
    }

    if( !something_failed )
        printf("\nSuccess.\n");
    else printf("\nFailure.\n");

    if(something_failed)
        system("/bin/bash -c 'read -p \"Press Any Key\"'");

    return 0;
}